

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef module,BinaryenType type)

{
  HeapType type_00;
  BinaryenExpressionRef pEVar1;
  Builder local_20;
  Type local_18;
  Type type_;
  
  local_18.id = type;
  if ((6 < type) && (((uint)type & 3) == 2)) {
    local_20.wasm = module;
    type_00 = wasm::Type::getHeapType(&local_18);
    pEVar1 = (BinaryenExpressionRef)wasm::Builder::makeRefNull(&local_20,type_00);
    return pEVar1;
  }
  __assert_fail("type_.isNullable()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x637,"BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef, BinaryenType)");
}

Assistant:

BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef module,
                                      BinaryenType type) {
  Type type_(type);
  assert(type_.isNullable());
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefNull(type_.getHeapType()));
}